

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool Truncate(string *path,size_t size,string *err)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  int success;
  string *err_local;
  size_t size_local;
  string *path_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = truncate(pcVar2,size);
  if (-1 >= iVar1) {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::__cxx11::string::operator=((string *)err,pcVar2);
  }
  return -1 < iVar1;
}

Assistant:

bool Truncate(const string& path, size_t size, string* err) {
#ifdef _WIN32
  int fh = _sopen(path.c_str(), _O_RDWR | _O_CREAT, _SH_DENYNO,
                  _S_IREAD | _S_IWRITE);
  int success = _chsize(fh, size);
  _close(fh);
#else
  int success = truncate(path.c_str(), size);
#endif
  // Both truncate() and _chsize() return 0 on success and set errno and return
  // -1 on failure.
  if (success < 0) {
    *err = strerror(errno);
    return false;
  }
  return true;
}